

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxerManager.cpp
# Opt level: O2

void __thiscall MuxerManager::parseMuxOpt(MuxerManager *this,string *opts)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  int32_t iVar5;
  long lVar6;
  long lVar7;
  int64_t iVar8;
  int64_t *piVar9;
  size_type sVar10;
  pointer value;
  double dVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paramPair;
  string postfix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  params;
  string prefix;
  
  splitQuotedStr_abi_cxx11_(&params,(opts->_M_dataplus)._M_p,' ');
  value = params.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (value == params.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&params);
      return;
    }
    trimStr(&postfix,value);
    splitStr_abi_cxx11_(&paramPair,postfix._M_dataplus._M_p,'=');
    std::__cxx11::string::~string((string *)&postfix);
    if (paramPair.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        paramPair.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar4 = std::operator==(paramPair.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,"--start-time");
      if ((bVar4) &&
         (0x20 < (ulong)((long)paramPair.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)paramPair.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start))) {
        lVar6 = std::__cxx11::string::find
                          ((char *)(paramPair.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1),0x204985);
        if (lVar6 == -1) {
          iVar8 = strToInt64(paramPair.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
          lVar6 = iVar8 * 2;
        }
        else {
          dVar11 = timeToFloat(paramPair.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 1);
          lVar6 = llround(dVar11 * 90000.0);
        }
        this->m_ptsOffset = lVar6;
      }
      else {
        bVar4 = std::operator==(paramPair.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,"--no-asyncio");
        if (bVar4) {
          this->m_asyncMode = false;
        }
        else {
          bVar4 = std::operator==(paramPair.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,"--cut-start");
          if (!bVar4) {
            bVar4 = std::operator==(paramPair.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,"--cut-end");
            if (!bVar4) {
              bVar4 = std::operator==(paramPair.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,"--split-duration");
              if (!bVar4) {
                bVar4 = std::operator==(paramPair.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,"--split-size");
                if (!bVar4) {
                  bVar4 = std::operator==(paramPair.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          "--extra-iso-space");
                  if (bVar4) {
                    iVar5 = strToInt32(paramPair.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 1);
                    this->m_extraIsoBlocks = iVar5;
                  }
                  else {
                    bVar4 = std::operator==(paramPair.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start,"--blu-ray");
                    if (!bVar4) {
                      bVar4 = std::operator==(paramPair.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                              "--blu-ray-v3");
                      if (!bVar4) {
                        bVar4 = std::operator==(paramPair.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start,"--avchd")
                        ;
                        if (!bVar4) {
                          bVar4 = std::operator==(paramPair.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  "--demux");
                          if (bVar4) {
                            this->m_demuxMode = true;
                          }
                          else {
                            bVar4 = std::operator==(paramPair.
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  "--constant-iso-hdr");
                            if (bVar4) {
                              this->m_reproducibleIsoHeader = true;
                            }
                          }
                          goto LAB_001ca158;
                        }
                      }
                    }
                    this->m_bluRayMode = true;
                  }
                  goto LAB_001ca158;
                }
              }
              if (this->m_extraIsoBlocks == 0) {
                this->m_extraIsoBlocks = 4;
              }
              goto LAB_001ca158;
            }
          }
          postfix._M_dataplus._M_p = (pointer)&postfix.field_2;
          postfix._M_string_length = 0;
          postfix.field_2._M_local_buf[0] = '\0';
          pcVar2 = paramPair.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
          sVar3 = paramPair.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length;
          for (sVar10 = 0; sVar3 != sVar10; sVar10 = sVar10 + 1) {
            cVar1 = pcVar2[sVar10];
            if (cVar1 != '.' && 9 < (byte)(cVar1 - 0x30U)) {
              std::__cxx11::string::push_back((char)&postfix);
            }
          }
          strToUpperCase(&prefix,&postfix);
          std::__cxx11::string::operator=((string *)&postfix,(string *)&prefix);
          std::__cxx11::string::~string((string *)&prefix);
          bVar4 = std::operator==(&postfix,"MS");
          lVar6 = 0x50bfe0;
          if (!bVar4) {
            bVar4 = std::operator==(&postfix,"S");
            lVar6 = 0x13b6d8300;
            if (!bVar4) {
              bVar4 = std::operator==(&postfix,"MIN");
              lVar6 = 1;
              if (bVar4) {
                lVar6 = 0x49edaab400;
              }
            }
          }
          std::__cxx11::string::substr
                    ((ulong)&prefix,
                     (ulong)(paramPair.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 1));
          bVar4 = std::operator==(paramPair.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,"--cut-start");
          if (bVar4) {
            lVar7 = strToInt64(prefix._M_dataplus._M_p);
            piVar9 = &this->m_cutStart;
          }
          else {
            lVar7 = strToInt64(prefix._M_dataplus._M_p);
            piVar9 = &this->m_cutEnd;
          }
          *piVar9 = lVar7 * lVar6;
          std::__cxx11::string::~string((string *)&prefix);
          std::__cxx11::string::~string((string *)&postfix);
        }
      }
    }
LAB_001ca158:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&paramPair);
    value = value + 1;
  } while( true );
}

Assistant:

void MuxerManager::parseMuxOpt(const string& opts)
{
    const vector<string> params = splitQuotedStr(opts.c_str(), ' ');
    for (auto& i : params)
    {
        vector<string> paramPair = splitStr(trimStr(i).c_str(), '=');
        if (paramPair.empty())
            continue;

        if (paramPair[0] == "--start-time" && paramPair.size() > 1)
        {
            if (paramPair[1].find(":") != string::npos)
                m_ptsOffset = llround(timeToFloat(paramPair[1]) * 90000.0);
            else
                m_ptsOffset = strToInt64(paramPair[1].c_str()) * 2;  // source in a 45Khz clock
        }
        else if (paramPair[0] == "--no-asyncio")
            setAsyncMode(false);
        else if (paramPair[0] == "--cut-start" || paramPair[0] == "--cut-end")
        {
            int64_t coeff = 1;
            string postfix;
            for (const auto j : paramPair[1])
            {
                if (!((j >= '0' && j <= '9') || j == '.'))
                    postfix += j;
            }

            postfix = strToUpperCase(postfix);

            if (postfix == "MS")
                coeff = INTERNAL_PTS_FREQ / 1000;
            else if (postfix == "S")
                coeff = INTERNAL_PTS_FREQ;
            else if (postfix == "MIN")
                coeff = 60 * INTERNAL_PTS_FREQ;
            string prefix = paramPair[1].substr(0, paramPair[1].size() - postfix.size());
            if (paramPair[0] == "--cut-start")
                setCutStart(strToInt64(prefix.c_str()) * coeff);
            else
                setCutEnd(strToInt64(prefix.c_str()) * coeff);
        }
        else if (paramPair[0] == "--split-duration" || paramPair[0] == "--split-size")
        {
            if (m_extraIsoBlocks == 0)
                m_extraIsoBlocks = 4;
        }
        else if (paramPair[0] == "--extra-iso-space")
        {
            m_extraIsoBlocks = strToInt32(paramPair[1]);
        }
        else if (paramPair[0] == "--blu-ray" || paramPair[0] == "--blu-ray-v3" || paramPair[0] == "--avchd")
        {
            m_bluRayMode = true;
        }
        else if (paramPair[0] == "--demux")
        {
            m_demuxMode = true;
        }
        else if (paramPair[0] == "--constant-iso-hdr")
        {
            m_reproducibleIsoHeader = true;
        }
    }
}